

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

bool __thiscall QPrinterInfo::isNull(QPrinterInfo *this)

{
  QPrintDevice *this_00;
  bool bVar1;
  QPrintDevice *pQVar2;
  
  this_00 = &((this->d_ptr).d)->m_printDevice;
  if ((char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_shared_null>::guard._q_value.
            super___atomic_base<signed_char>._M_i < -1) {
    pQVar2 = (QPrintDevice *)0x0;
  }
  else {
    pQVar2 = &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_shared_null>_>::
              instance()->m_printDevice;
  }
  if (this_00 == pQVar2) {
    bVar1 = true;
  }
  else {
    bVar1 = QPrintDevice::isValid(this_00);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }